

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<unsigned_char> * __thiscall
kj::Array<unsigned_char>::operator=(Array<unsigned_char> *this,Array<unsigned_char> *other)

{
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (uchar *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }